

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSE.cpp
# Opt level: O0

void ac::core::cpu::conv3x3_1to8_sse(Image *src,Image *dst,float *kernels,float *biases)

{
  ElementType EVar1;
  Image *in_RDI;
  
  EVar1 = Image::type(in_RDI);
  if (EVar1 == 1) {
    conv3x3_sse_cin1<unsigned_char,float,8>(src,dst,kernels,biases);
  }
  else if (EVar1 == 2) {
    conv3x3_sse_cin1<unsigned_short,float,8>(src,dst,kernels,biases);
  }
  else if (EVar1 == 0x204) {
    conv3x3_sse_cin1<float,float,8>(src,dst,kernels,biases);
  }
  return;
}

Assistant:

void conv3x3_1to8_sse(const Image& src, Image& dst, const float* kernels, const float* biases)
    {
        switch (src.type())
        {
        case Image::UInt8:
            conv3x3_sse_cin1<std::uint8_t, float, 8>(src, dst, kernels, biases);
            break;
        case Image::UInt16:
            conv3x3_sse_cin1<std::uint16_t, float, 8>(src, dst, kernels, biases);
            break;
        case Image::Float32:
            conv3x3_sse_cin1<float, float, 8>(src, dst, kernels, biases);
            break;
        }
    }